

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall
Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::expand
          (DArray<DP::SimpleCongruenceClosure::ConstInfo> *this,size_t s)

{
  ConstInfo *pCVar1;
  uint *puVar2;
  uint64_t uVar3;
  Literal *pLVar4;
  CPair CVar5;
  Literal *pLVar6;
  undefined7 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  SignatureKind SVar13;
  ConstInfo *__s;
  ulong uVar14;
  ConstInfo *pCVar15;
  ulong uVar16;
  ConstInfo *oldAddr;
  ulong uVar17;
  ConstInfo *this_00;
  ConstInfo *pCVar18;
  
  uVar14 = this->_capacity;
  if (uVar14 < s) {
    uVar17 = uVar14 * 2;
    if (uVar17 < s || uVar17 - s == 0) {
      uVar17 = s;
    }
    uVar16 = uVar17 * 0xb8 + 0xf & 0xfffffffffffffff0;
    if (uVar16 == 0) {
      __s = (ConstInfo *)
            FixedSizeAllocator<8UL>::alloc((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR)
      ;
    }
    else if (uVar16 < 0x11) {
      __s = (ConstInfo *)
            FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar16 < 0x19) {
      __s = (ConstInfo *)
            FixedSizeAllocator<24UL>::alloc
                      ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar16 < 0x21) {
      __s = (ConstInfo *)
            FixedSizeAllocator<32UL>::alloc
                      ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar16 < 0x31) {
      __s = (ConstInfo *)
            FixedSizeAllocator<48UL>::alloc
                      ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar16 < 0x41) {
      __s = (ConstInfo *)
            FixedSizeAllocator<64UL>::alloc
                      ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      __s = (ConstInfo *)::operator_new(uVar16,0x10);
    }
    pCVar1 = this->_array;
    this->_capacity = uVar17;
    this->_array = __s;
    pCVar18 = __s + uVar17;
    if (this->_size != 0) {
      pCVar15 = __s + this->_size;
      this_00 = pCVar1;
      do {
        uVar12 = this_00->sigSymbol;
        SVar13 = this_00->sigSymKind;
        uVar3 = (this_00->term)._content;
        pLVar4 = this_00->lit;
        CVar5 = this_00->namedPair;
        uVar8 = this_00->reprConst;
        uVar9 = this_00->proofPredecessor;
        uVar10 = (this_00->predecessorPremise).c1;
        uVar11 = (this_00->predecessorPremise).c2;
        uVar7 = *(undefined7 *)&(this_00->predecessorPremise).field_0x9;
        pLVar6 = (this_00->predecessorPremise).foPremise;
        (__s->predecessorPremise).foOrigin = (this_00->predecessorPremise).foOrigin;
        *(undefined7 *)&(__s->predecessorPremise).field_0x9 = uVar7;
        (__s->predecessorPremise).foPremise = pLVar6;
        __s->reprConst = uVar8;
        __s->proofPredecessor = uVar9;
        (__s->predecessorPremise).c1 = uVar10;
        (__s->predecessorPremise).c2 = uVar11;
        __s->lit = pLVar4;
        __s->namedPair = CVar5;
        __s->sigSymbol = uVar12;
        __s->sigSymKind = SVar13;
        (__s->term)._content = uVar3;
        (__s->classList)._capacity = 0;
        (__s->classList)._stack = (uint *)0x0;
        (__s->classList)._cursor = (uint *)0x0;
        (__s->classList)._end = (uint *)0x0;
        (__s->classList)._capacity = (this_00->classList)._capacity;
        (this_00->classList)._capacity = 0;
        (__s->classList)._cursor = (this_00->classList)._cursor;
        (this_00->classList)._cursor = (uint *)0x0;
        puVar2 = (__s->classList)._end;
        (__s->classList)._end = (this_00->classList)._end;
        (this_00->classList)._end = puVar2;
        puVar2 = (__s->classList)._stack;
        (__s->classList)._stack = (this_00->classList)._stack;
        (this_00->classList)._stack = puVar2;
        (__s->useList)._cursor = (uint *)0x0;
        (__s->useList)._end = (uint *)0x0;
        (__s->useList)._capacity = 0;
        (__s->useList)._stack = (uint *)0x0;
        (__s->useList)._capacity = (this_00->useList)._capacity;
        (this_00->useList)._capacity = 0;
        (__s->useList)._cursor = (this_00->useList)._cursor;
        (this_00->useList)._cursor = (uint *)0x0;
        puVar2 = (__s->useList)._end;
        (__s->useList)._end = (this_00->useList)._end;
        (this_00->useList)._end = puVar2;
        puVar2 = (__s->useList)._stack;
        (__s->useList)._stack = (this_00->useList)._stack;
        (this_00->useList)._stack = puVar2;
        __s->processed = this_00->processed;
        (__s->upEdges)._capacity = 0;
        (__s->upEdges)._stack = (uint *)0x0;
        (__s->upEdges)._cursor = (uint *)0x0;
        (__s->upEdges)._end = (uint *)0x0;
        (__s->upEdges)._capacity = (this_00->upEdges)._capacity;
        (this_00->upEdges)._capacity = 0;
        (__s->upEdges)._cursor = (this_00->upEdges)._cursor;
        (this_00->upEdges)._cursor = (uint *)0x0;
        puVar2 = (__s->upEdges)._end;
        (__s->upEdges)._end = (this_00->upEdges)._end;
        (this_00->upEdges)._end = puVar2;
        puVar2 = (__s->upEdges)._stack;
        (__s->upEdges)._stack = (this_00->upEdges)._stack;
        (this_00->upEdges)._stack = puVar2;
        uVar7 = *(undefined7 *)&this_00->field_0xa9;
        uVar3 = (this_00->normalForm)._content;
        __s->half_normalized = this_00->half_normalized;
        *(undefined7 *)&__s->field_0xa9 = uVar7;
        (__s->normalForm)._content = uVar3;
        __s = __s + 1;
        DP::SimpleCongruenceClosure::ConstInfo::~ConstInfo(this_00);
        this_00 = this_00 + 1;
      } while (__s != pCVar15);
    }
    for (; __s != pCVar18; __s = __s + 1) {
      memset(__s,0,0xb8);
      (__s->term)._content = 2;
      (__s->namedPair).first = 0;
      (__s->namedPair).second = 0;
      (__s->predecessorPremise).c1 = 0;
      (__s->predecessorPremise).c2 = 0;
      (__s->predecessorPremise).foOrigin = false;
      (__s->predecessorPremise).foPremise = (Literal *)0x0;
      (__s->classList)._capacity = 0;
      (__s->classList)._stack = (uint *)0x0;
      (__s->classList)._cursor = (uint *)0x0;
      (__s->classList)._end = (uint *)0x0;
      (__s->useList)._capacity = 0;
      (__s->useList)._stack = (uint *)0x0;
      (__s->useList)._cursor = (uint *)0x0;
      (__s->useList)._end = (uint *)0x0;
      (__s->upEdges)._capacity = 0;
      (__s->upEdges)._stack = (uint *)0x0;
      (__s->upEdges)._cursor = (uint *)0x0;
      (__s->upEdges)._end = (uint *)0x0;
      (__s->normalForm)._content = 2;
    }
    this->_size = s;
    if (pCVar1 != (ConstInfo *)0x0) {
      uVar14 = uVar14 * 0xb8 + 0xf & 0xfffffffffffffff0;
      if (uVar14 == 0) {
        pCVar1->sigSymbol = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        pCVar1->sigSymKind = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pCVar1;
      }
      else if (uVar14 < 0x11) {
        pCVar1->sigSymbol = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        pCVar1->sigSymKind = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar1;
      }
      else if (uVar14 < 0x19) {
        pCVar1->sigSymbol = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        pCVar1->sigSymKind = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pCVar1;
      }
      else if (uVar14 < 0x21) {
        pCVar1->sigSymbol = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        pCVar1->sigSymKind = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pCVar1;
      }
      else if (uVar14 < 0x31) {
        pCVar1->sigSymbol = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        pCVar1->sigSymKind = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pCVar1;
      }
      else {
        if (0x40 < uVar14) {
          operator_delete(pCVar1,0x10);
          return;
        }
        pCVar1->sigSymbol = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        pCVar1->sigSymKind = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pCVar1;
      }
    }
  }
  else {
    this->_size = s;
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }